

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SViewFrustum.h
# Opt level: O2

void __thiscall irr::scene::SViewFrustum::recalculateBoundingSphere(SViewFrustum *this)

{
  vector3df *other;
  long lVar1;
  float *pfVar2;
  float fVar4;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar3 [16];
  float in_XMM1_Db;
  float fVar5;
  float fVar6;
  float fVar7;
  vector3df vVar8;
  vector3d<float> vVar9;
  float diam [8];
  vector3d<float> local_108;
  undefined4 uStack_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  float local_a8;
  float fStack_a4;
  float local_98;
  float fStack_94;
  vector3d<float> local_88;
  vector3d<float> local_7c;
  vector3d<float> local_70;
  vector3d<float> local_64;
  vector3d<float> local_58;
  vector3d<float> local_4c;
  vector3d<float> local_40;
  vector3d<float> local_34;
  
  vVar8 = getNearLeftUp(this);
  local_e8 = vVar8.Z;
  local_b8 = vVar8._0_8_;
  fStack_e4 = in_XMM1_Db;
  uStack_b0 = extraout_XMM0_Qb;
  vVar8 = getNearRightUp(this);
  local_98 = vVar8.Z;
  local_c8 = vVar8._0_8_;
  uStack_c0 = extraout_XMM0_Qb_00;
  fStack_94 = in_XMM1_Db;
  vVar8 = getFarLeftUp(this);
  local_a8 = vVar8.Z;
  local_d8 = vVar8._0_8_;
  fStack_a4 = in_XMM1_Db;
  vVar8 = getFarRightUp(this);
  fVar5 = (float)local_d8 - vVar8.X;
  fVar6 = local_d8._4_4_ - vVar8.Y;
  fVar7 = local_d8._4_4_ - vVar8.Y;
  fVar4 = local_a8 - vVar8.Z;
  auVar3._0_4_ = (local_e8 - local_98) * (local_e8 - local_98) +
                 ((float)local_b8 - (float)local_c8) * ((float)local_b8 - (float)local_c8) +
                 (local_b8._4_4_ - local_c8._4_4_) * (local_b8._4_4_ - local_c8._4_4_);
  auVar3._4_4_ = fVar4 * fVar4 + fVar5 * fVar5 + fVar7 * fVar7;
  auVar3._8_4_ = (fStack_e4 - fStack_94) * (fStack_e4 - fStack_94) +
                 (local_b8._4_4_ - local_c8._4_4_) * (local_b8._4_4_ - local_c8._4_4_) +
                 ((float)uStack_b0 - (float)uStack_c0) * ((float)uStack_b0 - (float)uStack_c0);
  auVar3._12_4_ =
       (fStack_a4 - in_XMM1_Db) * (fStack_a4 - in_XMM1_Db) +
       fVar6 * fVar6 + (uStack_b0._4_4_ - uStack_c0._4_4_) * (uStack_b0._4_4_ - uStack_c0._4_4_);
  auVar3 = sqrtps(auVar3,auVar3);
  local_e8 = this->FarNearDistance;
  fStack_e4 = auVar3._4_4_;
  local_e8 = (((fStack_e4 + auVar3._0_4_) * (auVar3._0_4_ - fStack_e4)) / (local_e8 * 4.0) +
             local_e8) * -0.5 + local_e8;
  fStack_e0 = fStack_e4;
  fStack_dc = fStack_e4;
  vVar9 = core::vector3d<float>::operator-(&this->planes[1].Normal);
  local_88.Y = local_e8 * vVar9.Y;
  local_88.X = local_e8 * vVar9.X;
  local_88.Z = vVar9.Z * local_e8;
  vVar9 = core::vector3d<float>::operator+(&this->cameraPosition,&local_88);
  other = &this->BoundingCenter;
  (this->BoundingCenter).X = vVar9.X;
  (this->BoundingCenter).Y = vVar9.Y;
  (this->BoundingCenter).Z = vVar9.Z;
  vVar8 = getFarLeftUp(this);
  local_108._0_8_ = vVar8._0_8_;
  local_108.Z = vVar8.Z;
  local_88 = core::vector3d<float>::operator-(&local_108,other);
  pfVar2 = &local_88.Z;
  vVar8 = getFarRightUp(this);
  local_108._0_8_ = vVar8._0_8_;
  local_108.Z = vVar8.Z;
  local_7c = core::vector3d<float>::operator-(&local_108,other);
  vVar8 = getFarLeftDown(this);
  local_108._0_8_ = vVar8._0_8_;
  local_108.Z = vVar8.Z;
  local_70 = core::vector3d<float>::operator-(&local_108,other);
  vVar8 = getFarRightDown(this);
  local_108._0_8_ = vVar8._0_8_;
  local_108.Z = vVar8.Z;
  local_64 = core::vector3d<float>::operator-(&local_108,other);
  vVar8 = getNearRightDown(this);
  local_108._0_8_ = vVar8._0_8_;
  local_108.Z = vVar8.Z;
  local_58 = core::vector3d<float>::operator-(&local_108,other);
  vVar8 = getNearLeftDown(this);
  local_108._0_8_ = vVar8._0_8_;
  local_108.Z = vVar8.Z;
  local_4c = core::vector3d<float>::operator-(&local_108,other);
  vVar8 = getNearRightUp(this);
  local_108._0_8_ = vVar8._0_8_;
  local_108.Z = vVar8.Z;
  local_40 = core::vector3d<float>::operator-(&local_108,other);
  vVar8 = getNearLeftUp(this);
  local_108._0_8_ = vVar8._0_8_;
  local_108.Z = vVar8.Z;
  local_34 = core::vector3d<float>::operator-(&local_108,other);
  local_f8 = 0;
  uStack_f0 = 0;
  local_108.X = 0.0;
  local_108.Y = 0.0;
  local_108.Z = 0.0;
  uStack_fc = 0;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    (&local_108.X)[lVar1] =
         *pfVar2 * *pfVar2 +
         ((vector3d<float> *)(pfVar2 + -2))->X * ((vector3d<float> *)(pfVar2 + -2))->X +
         pfVar2[-1] * pfVar2[-1];
    pfVar2 = pfVar2 + 3;
  }
  fVar4 = 0.0;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    fVar5 = (&local_108.X)[lVar1];
    if ((&local_108.X)[lVar1] <= fVar4) {
      fVar5 = fVar4;
    }
    fVar4 = fVar5;
  }
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  this->BoundingRadius = fVar4;
  return;
}

Assistant:

inline void SViewFrustum::recalculateBoundingSphere()
{
	// Find the center
	const float shortlen = (getNearLeftUp() - getNearRightUp()).getLength();
	const float longlen = (getFarLeftUp() - getFarRightUp()).getLength();

	const float farlen = FarNearDistance;
	const float fartocenter = (farlen + (shortlen - longlen) * (shortlen + longlen) / (4 * farlen)) / 2;
	const float neartocenter = farlen - fartocenter;

	BoundingCenter = cameraPosition + -planes[VF_NEAR_PLANE].Normal * neartocenter;

	// Find the radius
	core::vector3df dir[8];
	dir[0] = getFarLeftUp() - BoundingCenter;
	dir[1] = getFarRightUp() - BoundingCenter;
	dir[2] = getFarLeftDown() - BoundingCenter;
	dir[3] = getFarRightDown() - BoundingCenter;
	dir[4] = getNearRightDown() - BoundingCenter;
	dir[5] = getNearLeftDown() - BoundingCenter;
	dir[6] = getNearRightUp() - BoundingCenter;
	dir[7] = getNearLeftUp() - BoundingCenter;

	u32 i = 0;
	float diam[8] = {0.f};

	for (i = 0; i < 8; ++i)
		diam[i] = dir[i].getLengthSQ();

	float longest = 0;

	for (i = 0; i < 8; ++i) {
		if (diam[i] > longest)
			longest = diam[i];
	}

	BoundingRadius = sqrtf(longest);
}